

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtree.c
# Opt level: O0

SubtreeArray ts_subtree_array_remove_trailing_extras(SubtreeArray *self)

{
  Subtree self_00;
  SubtreeArray SVar1;
  undefined4 uVar2;
  _Bool _Var3;
  Subtree child;
  uint32_t i;
  SubtreeArray *self_local;
  SubtreeArray result;
  
  memset(&self_local,0,0x10);
  uVar2 = self->size;
  while (child._4_4_ = uVar2 - 1, child._4_4_ != -1) {
    self_00 = self->contents[(uint)child._4_4_];
    _Var3 = ts_subtree_extra(self_00);
    if (!_Var3) break;
    array__grow((VoidArray *)&self_local,8);
    *(Subtree *)(&self_local->contents + (uint)result.contents) = self_00;
    result.contents._0_4_ = (uint)result.contents + 1;
    uVar2 = child._4_4_;
  }
  self->size = uVar2;
  ts_subtree_array_reverse((SubtreeArray *)&self_local);
  SVar1.size = (uint)result.contents;
  SVar1.contents = (Subtree *)self_local;
  SVar1.capacity = result.contents._4_4_;
  return SVar1;
}

Assistant:

SubtreeArray ts_subtree_array_remove_trailing_extras(SubtreeArray *self) {
  SubtreeArray result = array_new();

  uint32_t i = self->size - 1;
  for (; i + 1 > 0; i--) {
    Subtree child = self->contents[i];
    if (!ts_subtree_extra(child)) break;
    array_push(&result, child);
  }

  self->size = i + 1;
  ts_subtree_array_reverse(&result);
  return result;
}